

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O2

void compaction_failure_hangs_rollback_test(void)

{
  fdb_status fVar1;
  anomalous_callbacks *cbs;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  char *__format;
  long lVar6;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile_comp;
  fail_ctx_t fail_ctx;
  char keybuf [32];
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char bodybuf [128];
  char metabuf [32];
  fdb_config fconfig;
  fdb_doc *local_998 [301];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  cbs = get_default_anon_cbs();
  fail_ctx.start_failing_after = 0;
  fail_ctx.num_fails = 0;
  fail_ctx.num_ops = 0;
  cbs->fsync_cb = fsync_failure_cb;
  system("rm -rf  anomaly_test* > errorlog.txt");
  filemgr_ops_anomalous_init(cbs,&fail_ctx);
  fail_ctx.start_failing_after = 3;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.flags = 1;
  fconfig.purging_interval = 0;
  fdb_open(&dbfile,"anomaly_test2",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  uVar5 = 0;
  for (lVar6 = 0; lVar6 != 0x960; lVar6 = lVar6 + 8) {
    sprintf(keybuf,"key%d",uVar5 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar5 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar5 & 0xffffffff);
    sVar2 = strlen(keybuf);
    sVar3 = strlen(metabuf);
    sVar4 = strlen(bodybuf);
    fdb_doc_create((fdb_doc **)((long)local_998 + lVar6),keybuf,sVar2 + 1,metabuf,sVar3 + 1,bodybuf,
                   sVar4 + 1);
    fVar1 = fdb_set(db,*(fdb_doc **)((long)local_998 + lVar6));
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x3b4);
      compaction_failure_hangs_rollback_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x3b4,"void compaction_failure_hangs_rollback_test()");
    }
    if (uVar5 == 0x96) {
      fVar1 = fdb_commit(dbfile,'\x01');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0x3b7);
        compaction_failure_hangs_rollback_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x3b7,"void compaction_failure_hangs_rollback_test()");
      }
    }
    uVar5 = uVar5 + 1;
  }
  fVar1 = fdb_commit(dbfile,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x3bc);
    compaction_failure_hangs_rollback_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                  ,0x3bc,"void compaction_failure_hangs_rollback_test()");
  }
  fVar1 = fdb_open(&dbfile_comp,"anomaly_test2",&fconfig);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_compact(dbfile_comp,"anomaly_test3");
    if (fVar1 != FDB_RESULT_FSYNC_FAIL) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x3c4);
      compaction_failure_hangs_rollback_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_FSYNC_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x3c4,"void compaction_failure_hangs_rollback_test()");
    }
    fail_ctx.start_failing_after = 99999;
    fVar1 = fdb_close(dbfile_comp);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fVar1 = fdb_rollback(&db,0x97);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_close(dbfile);
        for (lVar6 = 0; lVar6 != 300; lVar6 = lVar6 + 1) {
          fdb_doc_free(local_998[lVar6]);
        }
        fdb_shutdown();
        sprintf(bodybuf,"compaction failure hangs rollback test :%d failures out of %d commits",
                fail_ctx._0_8_ & 0xffffffff,(ulong)fail_ctx._0_8_ >> 0x20);
        __format = "%s PASSED\n";
        if (compaction_failure_hangs_rollback_test()::__test_pass != '\0') {
          __format = "%s FAILED\n";
        }
        fprintf(_stderr,__format,bodybuf);
        return;
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x3ce);
      compaction_failure_hangs_rollback_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x3ce,"void compaction_failure_hangs_rollback_test()");
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x3c8);
    compaction_failure_hangs_rollback_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                  ,0x3c8,"void compaction_failure_hangs_rollback_test()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
          ,0x3bf);
  compaction_failure_hangs_rollback_test()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0x3bf,"void compaction_failure_hangs_rollback_test()");
}

Assistant:

void compaction_failure_hangs_rollback_test()
{
    TEST_INIT();

    int i, r;
    int n=300; // n: # prefixes, m: # postfixes
    fdb_file_handle *dbfile, *dbfile_comp;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_status status;

    char keybuf[32], metabuf[32], bodybuf[128];
    // Get the default callbacks which result in normal operation for other ops
    struct anomalous_callbacks *commit_fail_cb = get_default_anon_cbs();
    fail_ctx_t fail_ctx;
    memset(&fail_ctx, 0, sizeof(fail_ctx_t));
    // Modify the fsync callback to redirect to test-specific function
    commit_fail_cb->fsync_cb = &fsync_failure_cb;

    // remove previous anomaly_test files
    r = system(SHELL_DEL" anomaly_test* > errorlog.txt");
    (void)r;

    // Reset anomalous behavior stats..
    filemgr_ops_anomalous_init(commit_fail_cb, &fail_ctx);

    // The number indicates the count after which all commits begin to fail
    // This number is unique to this test suite and can cause a hang
    // if the underlying fixed issue resurfaces
    fail_ctx.start_failing_after = 3;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;

    // open db
    fdb_open(&dbfile, "anomaly_test2", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf)+1,
                       (void*)metabuf, strlen(metabuf)+1,
                       (void*)bodybuf, strlen(bodybuf)+1);
        status = fdb_set(db, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (i == n / 2) {
            status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_open(&dbfile_comp, "anomaly_test2", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Due to anomalous ops this compaction should fail after new file
    // is created and a final commit is attempted..
    status = fdb_compact(dbfile_comp, "anomaly_test3");
    TEST_CHK(status == FDB_RESULT_FSYNC_FAIL);
    fail_ctx.start_failing_after = 99999; // reset this so rollback can proceed

    status = fdb_close(dbfile_comp);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // The above compaction failure should not result in rollback hanging..
    // MB-21953: Rollback hangs infinitely in decaying_usleep due to compaction
    // failure above which does not reset the file status to NORMAL
    status = fdb_rollback(&db, n/2 + 1);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    sprintf(bodybuf, "compaction failure hangs rollback test :%d "
                     "failures out of %d commits",
                     fail_ctx.num_fails, fail_ctx.num_ops);

    TEST_RESULT(bodybuf);
}